

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O3

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_par_expression_t *expr)

{
  typed_expression_t *ptVar1;
  string local_40;
  
  if ((expr->super_typed_expression_t)._type == EXPR_TYPE_BAD) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"a parenthesized","");
    invalid_expression(this,&expr->super_typed_expression_t,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  ptVar1 = typed_par_expression_t::expr(expr);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,this);
  return;
}

Assistant:

virtual void visit(tchecker::typed_par_expression_t const & expr)
  {
    if (expr.type() == tchecker::EXPR_TYPE_BAD)
      invalid_expression(expr, "a parenthesized");

    // Write bytecode
    expr.expr().visit(*this);
  }